

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

double ON_ArrayDotProduct(int dim,double *A,double *B)

{
  double local_30;
  double AoB;
  double *B_local;
  double *A_local;
  double dStack_10;
  int dim_local;
  
  if (dim == 1) {
    dStack_10 = *A * *B;
  }
  else if (dim == 2) {
    dStack_10 = *A * *B + A[1] * B[1];
  }
  else if (dim == 3) {
    dStack_10 = A[2] * B[2] + *A * *B + A[1] * B[1];
  }
  else if (dim == 4) {
    dStack_10 = A[3] * B[3] + A[2] * B[2] + *A * *B + A[1] * B[1];
  }
  else {
    local_30 = 0.0;
    AoB = (double)B;
    B_local = A;
    A_local._4_4_ = dim;
    while (A_local._4_4_ != 0) {
      local_30 = *B_local * *(double *)AoB + local_30;
      AoB = (double)((long)AoB + 8);
      B_local = B_local + 1;
      A_local._4_4_ = A_local._4_4_ + -1;
    }
    dStack_10 = local_30;
  }
  return dStack_10;
}

Assistant:

double ON_ArrayDotProduct(int dim, const double* A, const double* B)
{
  double AoB;
  // do low dimensional cases on one line so we get 80 bit
  // intermediate precision in optimized mode.
  if (dim==1) return (A[0]*B[0]);
  if (dim==2) return (A[0]*B[0] + A[1]*B[1]);
  if (dim==3) return (A[0]*B[0] + A[1]*B[1] + A[2]*B[2]);
  if (dim==4) return (A[0]*B[0] + A[1]*B[1] + A[2]*B[2] +A[3]*B[3]);
  AoB = 0.0;
  while (dim--) AoB += *A++ * *B++;
  return AoB;
}